

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O3

Status __thiscall
leveldb::anon_unknown_1::PosixWritableFile::WriteUnbuffered
          (PosixWritableFile *this,char *data,size_t size)

{
  Status in_RAX;
  Status SVar1;
  size_t in_RCX;
  
  if (in_RCX != 0) {
    do {
      in_RAX.state_ = (char *)write(*(int *)(data + 0x10010),(void *)size,in_RCX);
      if ((long)in_RAX.state_ < 0) {
        in_RAX.state_ = (char *)__errno_location();
        if (*(int *)in_RAX.state_ != 4) {
          SVar1 = PosixError((string *)this,(int)*(undefined8 *)(data + 0x10018));
          return (Status)SVar1.state_;
        }
      }
      else {
        size = size + (long)in_RAX.state_;
        in_RCX = in_RCX - (long)in_RAX.state_;
      }
    } while (in_RCX != 0);
  }
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
  return (Status)in_RAX.state_;
}

Assistant:

Status WriteUnbuffered(const char* data, size_t size) {
    while (size > 0) {
      ssize_t write_result = ::write(fd_, data, size);
      if (write_result < 0) {
        if (errno == EINTR) {
          continue;  // Retry
        }
        return PosixError(filename_, errno);
      }
      data += write_result;
      size -= write_result;
    }
    return Status::OK();
  }